

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

uint64_t uv__get_cgroup2_current_memory(char *buf)

{
  size_t sVar1;
  uint64_t uVar2;
  int n;
  char *p;
  char filename [4097];
  char *buf_local;
  
  unique0x1000006b = buf;
  sVar1 = strcspn(buf + 4,"\n");
  snprintf((char *)&p,0x1001,"/sys/fs/cgroup/%.*s/memory.current",sVar1 & 0xffffffff,buf + 4);
  uVar2 = uv__read_uint64((char *)&p);
  return uVar2;
}

Assistant:

static uint64_t uv__get_cgroup2_current_memory(char buf[static 1024]) {
  char filename[4097];
  char* p;
  int n;

  /* Find out where the controller is mounted. */
  p = buf + strlen("0::/");
  n = (int) strcspn(p, "\n");

  snprintf(filename, sizeof(filename),
           "/sys/fs/cgroup/%.*s/memory.current", n, p);
  return uv__read_uint64(filename);
}